

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

string * __thiscall
libcellml::Printer::PrinterImpl::printEncapsulation
          (string *__return_storage_ptr__,PrinterImpl *this,ComponentPtr *component,IdList *idList,
          bool autoIds)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_t sVar5;
  size_type *psVar6;
  size_t sVar7;
  string componentName;
  string local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ComponentPtr *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  IdList *local_80;
  string local_78;
  PrinterImpl *local_58;
  string local_50;
  
  local_90 = component;
  local_80 = idList;
  local_58 = this;
  NamedEntity::name_abi_cxx11_
            (&local_50,
             (NamedEntity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  local_b8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"<component_ref","");
  if (local_50._M_string_length != 0) {
    std::operator+(&local_b0," component=\"",&local_50);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar3[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            (&local_d8,
             &((local_90->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ComponentEntity);
  sVar2 = local_d8._M_string_length;
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 == 0) {
    if (!autoIds) goto LAB_0025a8e9;
    makeUniqueId(&local_78,local_80);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x2b5444);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = puVar4[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_b0._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar3[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
    ComponentEntity::encapsulationId_abi_cxx11_
              (&local_78,
               &((local_90->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x2b5444);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8.field_2._8_8_ = plVar3[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar6;
      local_d8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_0025a8e9:
  sVar5 = ComponentEntity::componentCount
                    (&((local_90->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  std::__cxx11::string::append((char *)local_b8);
  if (sVar5 != 0) {
    sVar7 = 0;
    do {
      ComponentEntity::component
                ((ComponentEntity *)&local_b0,
                 (size_t)(local_90->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      printEncapsulation(&local_d8,local_58,(ComponentPtr *)&local_b0,local_80,autoIds);
      std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
      }
      sVar7 = sVar7 + 1;
    } while (sVar5 != sVar7);
  }
  if (sVar5 != 0) {
    std::__cxx11::string::append((char *)local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return local_b8;
}

Assistant:

std::string Printer::PrinterImpl::printEncapsulation(const ComponentPtr &component, IdList &idList, bool autoIds)
{
    std::string componentName = component->name();
    std::string repr = "<component_ref";
    if (!componentName.empty()) {
        repr += " component=\"" + componentName + "\"";
    }
    if (!component->encapsulationId().empty()) {
        repr += " id=\"" + component->encapsulationId() + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }
    size_t componentCount = component->componentCount();
    if (componentCount > 0) {
        repr += ">";
    } else {
        repr += "/>";
    }
    for (size_t i = 0; i < componentCount; ++i) {
        repr += printEncapsulation(component->component(i), idList, autoIds);
    }
    if (componentCount > 0) {
        repr += "</component_ref>";
    }
    return repr;
}